

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O0

void __thiscall
Fl_PostScript_Graphics_Driver::write_rle85(Fl_PostScript_Graphics_Driver *this,uchar b,void *data)

{
  int iVar1;
  uchar local_29;
  undefined8 *puStack_28;
  uchar c;
  struct_rle85 *rle;
  void *data_local;
  Fl_PostScript_Graphics_Driver *pFStack_10;
  uchar b_local;
  Fl_PostScript_Graphics_Driver *this_local;
  
  puStack_28 = (undefined8 *)data;
  rle = (struct_rle85 *)data;
  data_local._7_1_ = b;
  pFStack_10 = this;
  if (0 < *(int *)((long)data + 0x8c)) {
    if ((b == *(uchar *)((long)data + 8)) && (*(int *)((long)data + 0x8c) < 0x80)) {
      *(int *)((long)data + 0x8c) = *(int *)((long)data + 0x8c) + 1;
      return;
    }
    local_29 = '\x01' - (char)*(undefined4 *)((long)data + 0x8c);
    write85(this,*data,&local_29,1);
    write85(this,(void *)*puStack_28,(uchar *)(puStack_28 + 1),1);
    *(undefined4 *)((long)puStack_28 + 0x8c) = 0;
  }
  if (((*(int *)(puStack_28 + 0x11) < 2) ||
      (data_local._7_1_ !=
       *(uchar *)((long)puStack_28 + (long)(*(int *)(puStack_28 + 0x11) + -1) + 8))) ||
     (data_local._7_1_ !=
      *(uchar *)((long)puStack_28 + (long)(*(int *)(puStack_28 + 0x11) + -2) + 8))) {
    if (0x7f < *(int *)(puStack_28 + 0x11)) {
      local_29 = (char)*(undefined4 *)(puStack_28 + 0x11) + 0xff;
      write85(this,(void *)*puStack_28,&local_29,1);
      write85(this,(void *)*puStack_28,(uchar *)(puStack_28 + 1),*(int *)(puStack_28 + 0x11));
      *(undefined4 *)(puStack_28 + 0x11) = 0;
    }
    iVar1 = *(int *)(puStack_28 + 0x11);
    *(int *)(puStack_28 + 0x11) = iVar1 + 1;
    *(uchar *)((long)puStack_28 + (long)iVar1 + 8) = data_local._7_1_;
  }
  else {
    if (2 < *(int *)(puStack_28 + 0x11)) {
      local_29 = (char)*(undefined4 *)(puStack_28 + 0x11) + 0xfd;
      write85(this,(void *)*puStack_28,&local_29,1);
      write85(this,(void *)*puStack_28,(uchar *)(puStack_28 + 1),*(int *)(puStack_28 + 0x11) + -2);
    }
    *(undefined4 *)((long)puStack_28 + 0x8c) = 3;
    *(uchar *)(puStack_28 + 1) = data_local._7_1_;
    *(undefined4 *)(puStack_28 + 0x11) = 0;
  }
  return;
}

Assistant:

void Fl_PostScript_Graphics_Driver::write_rle85(uchar b, void *data) // sends one input byte to RLE+ASCII85 encoding
{
  struct_rle85 *rle = (struct_rle85 *)data;
  uchar c;
  if (rle->run_length > 0) { // if within a run
    if (b == rle->buffer[0] &&  rle->run_length < 128) { // the run can be extended
      rle->run_length++;
      return;
    } else { // output the run
      c = (uchar)(257 - rle->run_length);
      write85(rle->data85, &c, 1); // the run-length info
      write85(rle->data85, rle->buffer, 1); // the byte of the run
      rle->run_length = 0;
    }
  }
  if (rle->count >= 2 && b == rle->buffer[rle->count-1] && b == rle->buffer[rle->count-2]) {
    // about to begin a run
    if (rle->count > 2) { // there is non-run data before the run in the buffer
      c = (uchar)(rle->count-2 - 1);
      write85(rle->data85, &c, 1); // length of non-run data
      write85(rle->data85, rle->buffer, rle->count-2); // non-run data
    }
    rle->run_length = 3;
    rle->buffer[0] = b;
    rle->count = 0;
    return;
  }
  if (rle->count >= 128) { // the non-run buffer is full, output it
    c = (uchar)(rle->count - 1);
    write85(rle->data85, &c, 1); // length of non-run data
    write85(rle->data85, rle->buffer, rle->count); // non-run data
    rle->count = 0;
  }
  rle->buffer[rle->count++] = b; // add byte to end of non-run buffer
}